

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sceneRender.cpp
# Opt level: O3

void __thiscall SceneRender::printDefines(SceneRender *this)

{
  Model *pMVar1;
  ostream *poVar2;
  ulong uVar3;
  
  if (this->m_background == true) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,".",1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
    std::ostream::put(-0x28);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"| BACKGROUND",0xc);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
    std::ostream::put(-0x28);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"+------------- ",0xf);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
    std::ostream::put(-0x28);
    std::ostream::flush();
    vera::HaveDefines::printDefines(&(this->m_background_shader).super_HaveDefines);
  }
  if (-1 < this->m_floor_subd) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,".",1);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
    std::ostream::put(-0x28);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"| FLOOR",7);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
    std::ostream::put(-0x28);
    std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"+------------- ",0xf);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
    std::ostream::put(-0x28);
    std::ostream::flush();
    (*(this->m_floor).mainShader.super_HaveDefines._vptr_HaveDefines[0x10])
              (&(this->m_floor).mainShader);
  }
  if ((this->m_devlook_spheres).super__Vector_base<vera::Model_*,_std::allocator<vera::Model_*>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      (this->m_devlook_spheres).super__Vector_base<vera::Model_*,_std::allocator<vera::Model_*>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    uVar3 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,".",1);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
      std::ostream::put(-0x28);
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"| DEVLOOK SPHERE ",0x11);
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
      std::ostream::put((char)poVar2);
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"+------------- ",0xf);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
      std::ostream::put(-0x28);
      std::ostream::flush();
      pMVar1 = (this->m_devlook_spheres).
               super__Vector_base<vera::Model_*,_std::allocator<vera::Model_*>_>._M_impl.
               super__Vector_impl_data._M_start[uVar3];
      (*(pMVar1->mainShader).super_HaveDefines._vptr_HaveDefines[0x10])(&pMVar1->mainShader);
      uVar3 = uVar3 + 1;
    } while (uVar3 < (ulong)((long)(this->m_devlook_spheres).
                                   super__Vector_base<vera::Model_*,_std::allocator<vera::Model_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(this->m_devlook_spheres).
                                   super__Vector_base<vera::Model_*,_std::allocator<vera::Model_*>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 3));
  }
  if ((this->m_devlook_billboards).super__Vector_base<vera::Model_*,_std::allocator<vera::Model_*>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (this->m_devlook_billboards).super__Vector_base<vera::Model_*,_std::allocator<vera::Model_*>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    uVar3 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,".",1);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
      std::ostream::put(-0x28);
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"| DEVLOOK BILLBOARD ",0x14);
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
      std::ostream::put((char)poVar2);
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"+------------- ",0xf);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
      std::ostream::put(-0x28);
      std::ostream::flush();
      pMVar1 = (this->m_devlook_billboards).
               super__Vector_base<vera::Model_*,_std::allocator<vera::Model_*>_>._M_impl.
               super__Vector_impl_data._M_start[uVar3];
      (*(pMVar1->mainShader).super_HaveDefines._vptr_HaveDefines[0x10])(&pMVar1->mainShader);
      uVar3 = uVar3 + 1;
    } while (uVar3 < (ulong)((long)(this->m_devlook_billboards).
                                   super__Vector_base<vera::Model_*,_std::allocator<vera::Model_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)(this->m_devlook_billboards).
                                   super__Vector_base<vera::Model_*,_std::allocator<vera::Model_*>_>
                                   ._M_impl.super__Vector_impl_data._M_start >> 3));
  }
  return;
}

Assistant:

void SceneRender::printDefines() {
    if (m_background) {
        std::cout << "." << std::endl;
        std::cout << "| BACKGROUND" << std::endl;
        std::cout << "+------------- " << std::endl;
        m_background_shader.printDefines();
    }

    if (m_floor_subd >= 0) {
        std::cout << "." << std::endl;
        std::cout << "| FLOOR" << std::endl;
        std::cout << "+------------- " << std::endl;
        m_floor.getShader()->printDefines();
    }

    for (size_t i = 0; i < m_devlook_spheres.size(); i++) {
        std::cout << "." << std::endl;
        std::cout << "| DEVLOOK SPHERE " << i << std::endl;
        std::cout << "+------------- " << std::endl;
        m_devlook_spheres[i]->getShader()->printDefines();
    }

    for (size_t i = 0; i < m_devlook_billboards.size(); i++) {
        std::cout << "." << std::endl;
        std::cout << "| DEVLOOK BILLBOARD " << i << std::endl;
        std::cout << "+------------- " << std::endl;
        m_devlook_billboards[i]->getShader()->printDefines();
    }
}